

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O2

uint128 __thiscall absl::operator>>(absl *this,uint128 lhs,int amount)

{
  byte bVar1;
  ulong uVar2;
  uint128 uVar3;
  uint128 uVar4;
  
  uVar2 = lhs.lo_;
  bVar1 = (byte)lhs.hi_;
  if ((int)lhs.hi_ < 0x40) {
    if ((int)lhs.hi_ != 0) {
      uVar3.lo_ = (ulong)this >> (bVar1 & 0x3f) | uVar2 << 0x40 - (bVar1 & 0x3f);
      uVar3.hi_ = uVar2 >> (bVar1 & 0x3f);
      return uVar3;
    }
  }
  else {
    this = (absl *)(uVar2 >> (bVar1 & 0x3f));
    uVar2 = 0;
  }
  uVar4.hi_ = uVar2;
  uVar4.lo_ = (uint64_t)this;
  return uVar4;
}

Assistant:

inline uint128 operator>>(uint128 lhs, int amount) {
  // uint64_t shifts of >= 64 are undefined, so we will need some
  // special-casing.
  if (amount < 64) {
    if (amount != 0) {
      return MakeUint128(Uint128High64(lhs) >> amount,
                         (Uint128Low64(lhs) >> amount) |
                             (Uint128High64(lhs) << (64 - amount)));
    }
    return lhs;
  }
  return MakeUint128(0, Uint128High64(lhs) >> (amount - 64));
}